

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O0

int ppc_store_slb(PowerPCCPU_conflict3 *cpu,target_ulong slot,target_ulong esid,target_ulong vsid)

{
  PPCHash64SegmentPageSizes *pPVar1;
  _Bool _Var2;
  ppc_slb_t *ppVar3;
  PPCHash64SegmentPageSizes *pPVar4;
  PPCHash64SegmentPageSizes *sps1;
  PPCHash64SegmentPageSizes *pPStack_48;
  int i;
  PPCHash64SegmentPageSizes *sps;
  ppc_slb_t *slb;
  CPUPPCState_conflict2 *env;
  target_ulong vsid_local;
  target_ulong esid_local;
  target_ulong slot_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  ppVar3 = (cpu->env).slb + slot;
  pPStack_48 = (PPCHash64SegmentPageSizes *)0x0;
  if (slot < cpu->hash64_opts->slb_size) {
    if ((esid & 0x7ffffff) == 0) {
      if ((vsid & 0x8000000000000000) == 0) {
        if (((vsid & 0xc000000000000000) == 0) || (_Var2 = ppc_hash64_has(cpu,1), _Var2)) {
          sps1._4_4_ = 0;
          while (((pPVar1 = pPStack_48, sps1._4_4_ < 8 &&
                  (pPVar4 = cpu->hash64_opts->sps + sps1._4_4_, pPVar4->page_shift != 0)) &&
                 (pPVar1 = pPVar4, (vsid & 0x130) != (ulong)pPVar4->slb_enc))) {
            sps1._4_4_ = sps1._4_4_ + 1;
          }
          pPStack_48 = pPVar1;
          if (pPStack_48 == (PPCHash64SegmentPageSizes *)0x0) {
            cpu_local._4_4_ = -1;
          }
          else {
            ppVar3->esid = esid;
            ppVar3->vsid = vsid;
            ppVar3->sps = pPStack_48;
            cpu_local._4_4_ = 0;
          }
        }
        else {
          cpu_local._4_4_ = -1;
        }
      }
      else {
        cpu_local._4_4_ = -1;
      }
    }
    else {
      cpu_local._4_4_ = -1;
    }
  }
  else {
    cpu_local._4_4_ = -1;
  }
  return cpu_local._4_4_;
}

Assistant:

int ppc_store_slb(PowerPCCPU *cpu, target_ulong slot,
                  target_ulong esid, target_ulong vsid)
{
    CPUPPCState *env = &cpu->env;
    ppc_slb_t *slb = &env->slb[slot];
    const PPCHash64SegmentPageSizes *sps = NULL;
    int i;

    if (slot >= cpu->hash64_opts->slb_size) {
        return -1; /* Bad slot number */
    }
    if (esid & ~(SLB_ESID_ESID | SLB_ESID_V)) {
        return -1; /* Reserved bits set */
    }
    if (vsid & (SLB_VSID_B & ~SLB_VSID_B_1T)) {
        return -1; /* Bad segment size */
    }
    if ((vsid & SLB_VSID_B) && !(ppc_hash64_has(cpu, PPC_HASH64_1TSEG))) {
        return -1; /* 1T segment on MMU that doesn't support it */
    }

    for (i = 0; i < PPC_PAGE_SIZES_MAX_SZ; i++) {
        const PPCHash64SegmentPageSizes *sps1 = &cpu->hash64_opts->sps[i];

        if (!sps1->page_shift) {
            break;
        }

        if ((vsid & SLB_VSID_LLP_MASK) == sps1->slb_enc) {
            sps = sps1;
            break;
        }
    }

    if (!sps) {
#if 0
        error_report("Bad page size encoding in SLB store: slot "TARGET_FMT_lu
                     " esid 0x"TARGET_FMT_lx" vsid 0x"TARGET_FMT_lx,
                     slot, esid, vsid);
#endif
        return -1;
    }

    slb->esid = esid;
    slb->vsid = vsid;
    slb->sps = sps;

#if 0
    LOG_SLB("%s: " TARGET_FMT_lu " " TARGET_FMT_lx " - " TARGET_FMT_lx
            " => %016" PRIx64 " %016" PRIx64 "\n", __func__, slot, esid, vsid,
            slb->esid, slb->vsid);
#endif

    return 0;
}